

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O2

int read_single_rle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              uint address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_Unsigned DVar2;
  int iVar3;
  Dwarf_Unsigned DVar4;
  char *pcVar5;
  Dwarf_Signed errval;
  ulong uVar6;
  ulong uVar7;
  Dwarf_Small *pDVar8;
  Dwarf_Unsigned DVar9;
  Dwarf_Unsigned lu_local;
  ulong local_60;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Small *local_38;
  
  if (enddata <= data) {
    pcVar5 = 
    "DW_DLE_RNGLISTS_ERROR: An rle entry begins past the end of its allowed space. Corrupt DWARF.";
    errval = 0x1d4;
    goto LAB_00172e4e;
  }
  bVar1 = *data;
  DVar4 = (Dwarf_Unsigned)bVar1;
  if (7 < bVar1) {
    dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
    dwarfstring_append_printf_u
              ((dwarfstring_s *)&lu_leblen,
               "DW_DLE_RNGLISTS_ERROR: The rangelists entry at .debug_rnglists offset 0x%x",
               dataoffset);
    dwarfstring_append_printf_u
              ((dwarfstring_s *)&lu_leblen," has code 0x%x which is unknown",(ulong)(uint)bVar1);
    pcVar5 = dwarfstring_string((dwarfstring_s *)&lu_leblen);
    _dwarf_error_string(dbg,error,0x1d4,pcVar5);
    dwarfstring_destructor((dwarfstring_s *)&lu_leblen);
    return 1;
  }
  pDVar8 = data + 1;
  switch(DVar4) {
  case 0:
    uVar7 = 1;
    DVar9 = DVar4;
    break;
  case 1:
    lu_leblen = 0;
    lu_local = 0;
    iVar3 = dwarf_decode_leb128((char *)pDVar8,&lu_leblen,&lu_local,(char *)enddata);
    if (iVar3 == 1) {
LAB_00172c26:
      pcVar5 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
      errval = 0x149;
      goto LAB_00172e4e;
    }
    pDVar8 = pDVar8 + lu_leblen;
    DVar4 = 0;
    DVar9 = lu_local;
    DVar2 = lu_leblen;
LAB_00172e10:
    uVar7 = DVar2 + 1;
    break;
  default:
    lu_leblen = 0;
    lu_local = 0;
    iVar3 = dwarf_decode_leb128((char *)pDVar8,&lu_leblen,&lu_local,(char *)enddata);
    if (iVar3 == 1) goto LAB_00172c26;
    local_60 = lu_local;
    pDVar8 = pDVar8 + lu_leblen;
    uVar6 = lu_leblen;
LAB_00172c8a:
    lu_leblen = 0;
    lu_local = 0;
    iVar3 = dwarf_decode_leb128((char *)pDVar8,&lu_leblen,&lu_local,(char *)enddata);
    if (iVar3 == 1) {
      pcVar5 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
      errval = 0x149;
      goto LAB_00172e4e;
    }
    uVar7 = uVar6 + lu_leblen + 1;
    DVar4 = lu_local;
    pDVar8 = pDVar8 + lu_leblen;
    DVar9 = local_60;
    break;
  case 5:
    lu_leblen = 0;
    uVar6 = (ulong)address_size;
    if (enddata < pDVar8 + uVar6) goto LAB_00172d63;
    (*dbg->de_copy_word)(&lu_leblen,pDVar8,uVar6);
    uVar7 = uVar6 + 1;
    DVar4 = 0;
    pDVar8 = pDVar8 + uVar6;
    DVar9 = lu_leblen;
    break;
  case 6:
    lu_leblen = 0;
    uVar6 = (ulong)address_size;
    if (pDVar8 + uVar6 <= enddata) {
      local_38 = pDVar8 + uVar6;
      (*dbg->de_copy_word)(&lu_leblen,pDVar8,uVar6);
      DVar4 = lu_leblen;
      lu_leblen = 0;
      pDVar8 = local_38 + uVar6;
      if (pDVar8 <= enddata) {
        local_60 = DVar4;
        (*dbg->de_copy_word)(&lu_leblen,local_38,uVar6);
        DVar4 = lu_leblen;
        DVar9 = local_60;
        DVar2 = uVar6 * 2;
        goto LAB_00172e10;
      }
    }
    goto LAB_00172d63;
  case 7:
    lu_leblen = 0;
    uVar6 = (ulong)address_size;
    local_38 = pDVar8 + uVar6;
    if (local_38 <= enddata) {
      (*dbg->de_copy_word)(&lu_leblen,pDVar8,uVar6);
      local_60 = lu_leblen;
      pDVar8 = local_38;
      goto LAB_00172c8a;
    }
LAB_00172d63:
    lu_leblen = 0;
    pcVar5 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
    errval = 0x14b;
    goto LAB_00172e4e;
  }
  if (enddata < pDVar8 || pDVar8 < data) {
    pcVar5 = "DW_DLE_RNGLISTS_ERROR: The end of an rle entry is past the end of its allowed space";
  }
  else {
    if (uVar7 <= (dbg->de_debug_rnglists).dss_size) {
      *bytes_count_out = (uint)uVar7;
      *entry_kind = (uint)bVar1;
      *entry_operand1 = DVar9;
      *entry_operand2 = DVar4;
      return 0;
    }
    pcVar5 = 
    "DW_DLE_RNGLISTS_ERROR: The number of bytes in a single rnglist entry is too large to be reasonable"
    ;
  }
  errval = 0x1d4;
LAB_00172e4e:
  _dwarf_error_string(dbg,error,errval,pcVar5);
  return 1;
}

Assistant:

static int
read_single_rle_entry(Dwarf_Debug dbg,
    Dwarf_Small   *data,
    Dwarf_Unsigned dataoffset,
    Dwarf_Small   *enddata,
    unsigned       address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Small *  startdata = 0;

    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            "DW_DLE_RNGLISTS_ERROR: "
            "An rle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_RLE_end_of_list: break;
    case DW_RLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_startx_endx:
    case DW_RLE_startx_length:
    case DW_RLE_offset_pair: {
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_end: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_length: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    default: {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR: "
            "The rangelists entry at .debug_rnglists"
            " offset 0x%x" ,dataoffset);
        dwarfstring_append_printf_u(&m,
            " has code 0x%x which is unknown",code);
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/

        Dwarf_Unsigned sectionsize = dbg->de_debug_rnglists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The end of an rle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The number of bytes in a single "
                "rnglist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }

    *bytes_count_out = (unsigned int)count;
    *entry_kind = code;
    *entry_operand1 = val1;
    *entry_operand2 = val2;
    return DW_DLV_OK;
}